

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_io.cpp
# Opt level: O0

sha1_hash * libtorrent::aux::hash_address(sha1_hash *__return_storage_ptr__,address *ip)

{
  bool bVar1;
  pointer data;
  pointer data_00;
  size_type sVar2;
  hasher local_60;
  undefined1 local_54 [12];
  bytes_type b_1;
  hasher local_40;
  address_v6 local_38;
  undefined1 local_20 [8];
  bytes_type b;
  address *ip_local;
  
  b._M_elems._8_8_ = ip;
  bVar1 = boost::asio::ip::address::is_v6(ip);
  if (bVar1) {
    boost::asio::ip::address::to_v6(&local_38,(address *)b._M_elems._8_8_);
    _local_20 = boost::asio::ip::address_v6::to_bytes(&local_38);
    data = ::std::array<unsigned_char,_16UL>::data((array<unsigned_char,_16UL> *)local_20);
    sVar2 = ::std::array<unsigned_char,_16UL>::size((array<unsigned_char,_16UL> *)local_20);
    lcrypto::hasher::hasher(&local_40,(char *)data,(int)sVar2);
    lcrypto::hasher::final(__return_storage_ptr__,&local_40);
    lcrypto::hasher::~hasher(&local_40);
  }
  else {
    boost::asio::ip::address::to_v4((address *)local_54);
    local_54._4_4_ = boost::asio::ip::address_v4::to_bytes((address_v4 *)local_54);
    data_00 = ::std::array<unsigned_char,_4UL>::data((array<unsigned_char,_4UL> *)(local_54 + 4));
    sVar2 = ::std::array<unsigned_char,_4UL>::size((array<unsigned_char,_4UL> *)(local_54 + 4));
    lcrypto::hasher::hasher(&local_60,(char *)data_00,(int)sVar2);
    lcrypto::hasher::final(__return_storage_ptr__,&local_60);
    lcrypto::hasher::~hasher(&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

sha1_hash hash_address(address const& ip)
	{
		if (ip.is_v6())
		{
			address_v6::bytes_type b = ip.to_v6().to_bytes();
			return hasher(reinterpret_cast<char const*>(b.data()), int(b.size())).final();
		}
		else
		{
			address_v4::bytes_type b = ip.to_v4().to_bytes();
			return hasher(reinterpret_cast<char const*>(b.data()), int(b.size())).final();
		}
	}